

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng::decode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uint *w,uint *h,
                    vector<unsigned_char,_std::allocator<unsigned_char>_> *in,
                    LodePNGColorType colortype,uint bitdepth)

{
  bool bVar1;
  uint uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  LodePNGColorType in_stack_000001ac;
  size_t in_stack_000001b0;
  uchar *in_stack_000001b8;
  uint *in_stack_000001c0;
  uint *in_stack_000001c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_000001d0;
  uint in_stack_000001e0;
  
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(in_RDI);
  if (!bVar1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RCX,0);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RCX);
  uVar2 = decode(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,
                 in_stack_000001b0,in_stack_000001ac,in_stack_000001e0);
  return uVar2;
}

Assistant:

unsigned decode(std::vector<unsigned char>& out, unsigned& w, unsigned& h,
                const std::vector<unsigned char>& in, LodePNGColorType colortype, unsigned bitdepth)
{
  return decode(out, w, h, in.empty() ? 0 : &in[0], (unsigned)in.size(), colortype, bitdepth);
}